

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O2

bool __thiscall ON_MeshTopology::IsValid(ON_MeshTopology *this)

{
  uint *puVar1;
  int *piVar2;
  ON_MeshTopologyEdge *pOVar3;
  int mesh_vertex_count;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int *piVar14;
  ON_MeshTopologyEdge *pOVar15;
  ON_MeshTopologyFace *pOVar16;
  ON_Mesh *pOVar17;
  uint uVar18;
  bool bVar19;
  int iVar20;
  ON_MeshTopology *pOVar21;
  void *__s;
  size_t sVar22;
  long lVar23;
  size_t size;
  ulong uVar24;
  ON_MeshFace *this_00;
  ulong uVar25;
  ulong uVar26;
  ON_MeshTopologyVertex *pOVar27;
  long lVar28;
  ulong uVar29;
  bool bVar30;
  int tfvi [4];
  ON_Workspace ws;
  ON_3fPoint p;
  ON_3dPoint local_48;
  
  ON_Workspace::ON_Workspace(&ws);
  if (((this->m_b32IsValid == 1) && (this->m_mesh != (ON_Mesh *)0x0)) &&
     (pOVar21 = ON_Mesh::Topology(this->m_mesh), pOVar21 == this)) {
    mesh_vertex_count = (this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
    size = (size_t)mesh_vertex_count;
    uVar4 = (this->m_topv).m_count;
    if (-1 < (int)uVar4 && (int)uVar4 <= mesh_vertex_count) {
      bVar30 = false;
      if (mesh_vertex_count < 1 || (ulong)uVar4 != 0) {
        uVar5 = (this->m_mesh->m_F).m_count;
        if ((this->m_topf).m_count == uVar5) {
          uVar6 = (this->m_tope).m_count;
          bVar30 = false;
          if (((int)uVar5 < 1 || 2 < (int)uVar6) &&
             ((this->m_topv_map).m_count == mesh_vertex_count)) {
            bVar30 = false;
            sVar22 = 0;
            do {
              if (size == sVar22) {
                __s = ON_Workspace::GetMemory(&ws,size);
                uVar29 = 0;
                memset(__s,0,size);
                goto LAB_00522406;
              }
              puVar1 = (uint *)((this->m_topv_map).m_a + sVar22);
              sVar22 = sVar22 + 1;
            } while (*puVar1 < uVar4);
          }
        }
      }
      goto LAB_0052235a;
    }
  }
LAB_00522358:
  bVar30 = false;
  goto LAB_0052235a;
LAB_00522406:
  if (uVar29 == uVar4) goto LAB_00522574;
  pOVar27 = (this->m_topv).m_a;
  if ((pOVar27[uVar29].m_v_count < 1) || (pOVar27 = pOVar27 + uVar29, pOVar27->m_vi == (int *)0x0))
  goto LAB_00522358;
  TopVertexPoint(&local_48,this,(int)uVar29);
  ON_3fPoint::operator=(&p,&local_48);
  for (lVar28 = 0; lVar28 < pOVar27->m_v_count; lVar28 = lVar28 + 1) {
    lVar23 = (long)pOVar27->m_vi[lVar28];
    bVar30 = false;
    if ((lVar23 < 0) || (mesh_vertex_count <= pOVar27->m_vi[lVar28])) goto LAB_0052235a;
    if ((*(char *)((long)__s + lVar23) != '\0') ||
       ((iVar20 = compare3fPoint(&p,(this->m_mesh->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a +
                                    lVar23), iVar20 != 0 ||
        (uVar29 != (uint)(this->m_topv_map).m_a[lVar23])))) goto LAB_00522358;
    *(undefined1 *)((long)__s + lVar23) = 1;
  }
  iVar20 = pOVar27->m_tope_count;
  if (((long)iVar20 < 0) || (piVar14 = pOVar27->m_topei, (piVar14 == (int *)0x0) != (iVar20 == 0)))
  goto LAB_00522358;
  pOVar15 = (this->m_tope).m_a;
  for (lVar28 = 0; lVar28 != iVar20; lVar28 = lVar28 + 1) {
    iVar7 = piVar14[lVar28];
    lVar23 = (long)iVar7;
    bVar30 = false;
    if ((lVar23 < 0) || ((int)uVar6 <= iVar7)) goto LAB_0052235a;
    if ((uVar29 != (uint)pOVar15[lVar23].m_topvi[0]) && (uVar29 != (uint)pOVar15[lVar23].m_topvi[1])
       ) goto LAB_00522358;
    lVar23 = 0;
    while (lVar28 != lVar23) {
      bVar30 = false;
      piVar2 = piVar14 + lVar23;
      lVar23 = lVar23 + 1;
      if (*piVar2 == iVar7) goto LAB_0052235a;
    }
  }
  uVar29 = uVar29 + 1;
  goto LAB_00522406;
LAB_00522574:
  piVar14 = (this->m_topv_map).m_a;
  pOVar27 = (this->m_topv).m_a;
  for (sVar22 = 0; sVar22 != size; sVar22 = sVar22 + 1) {
    if ((*(char *)((long)__s + sVar22) != '\x01') || (uVar8 = piVar14[sVar22], uVar4 <= uVar8))
    goto LAB_00522358;
    uVar9 = pOVar27[uVar8].m_v_count;
    if (pOVar27[uVar8].m_v_count < 1) {
      uVar9 = 0;
    }
    uVar29 = 0;
    do {
      if (uVar9 == uVar29) goto LAB_00522358;
      puVar1 = (uint *)(pOVar27[uVar8].m_vi + uVar29);
      uVar29 = uVar29 + 1;
    } while (sVar22 != *puVar1);
  }
  pOVar15 = (this->m_tope).m_a;
  pOVar16 = (this->m_topf).m_a;
  uVar29 = 0;
  if (0 < (int)uVar6) {
    uVar29 = (ulong)uVar6;
  }
  for (uVar24 = 0; uVar24 != uVar29; uVar24 = uVar24 + 1) {
    uVar8 = pOVar15[uVar24].m_topvi[0];
    if (uVar4 <= uVar8) goto LAB_00522358;
    uVar9 = pOVar15[uVar24].m_topvi[1];
    bVar30 = false;
    if ((uVar4 <= uVar9) || (uVar8 == uVar9)) goto LAB_0052235a;
    uVar18 = pOVar27[uVar8].m_tope_count;
    if (pOVar27[uVar8].m_tope_count < 1) {
      uVar18 = 0;
    }
    uVar26 = 0;
    do {
      if (uVar18 == uVar26) goto LAB_00522358;
      puVar1 = (uint *)(pOVar27[uVar8].m_topei + uVar26);
      uVar26 = uVar26 + 1;
    } while (uVar24 != *puVar1);
    uVar26 = (ulong)(uint)pOVar27[(int)uVar9].m_tope_count;
    if (pOVar27[(int)uVar9].m_tope_count < 1) {
      uVar26 = 0;
    }
    uVar25 = 0;
    do {
      if (uVar26 == uVar25) goto LAB_00522358;
      puVar1 = (uint *)(pOVar27[(int)uVar9].m_topei + uVar25);
      uVar25 = uVar25 + 1;
    } while (uVar24 != *puVar1);
    iVar20 = pOVar15[uVar24].m_topf_count;
    if (((long)iVar20 < 0) || ((pOVar15[uVar24].m_topfi == (int *)0x0) != (iVar20 == 0)))
    goto LAB_00522358;
    for (lVar28 = 0; lVar28 != iVar20; lVar28 = lVar28 + 1) {
      iVar7 = pOVar15[uVar24].m_topfi[lVar28];
      bVar30 = false;
      if (((long)iVar7 < 0) || ((int)uVar5 <= iVar7)) goto LAB_0052235a;
      lVar23 = 0;
      do {
        if (lVar23 == 4) goto LAB_00522358;
        piVar2 = pOVar16[iVar7].m_topei + lVar23;
        lVar23 = lVar23 + 1;
      } while (uVar24 != (uint)*piVar2);
    }
  }
  uVar29 = (ulong)uVar5;
  if ((int)uVar5 < 1) {
    uVar29 = 0;
  }
  pOVar17 = this->m_mesh;
  for (uVar24 = 0; bVar30 = uVar24 == uVar29, !bVar30; uVar24 = uVar24 + 1) {
    iVar20 = pOVar16[uVar24].m_topei[0];
    if ((iVar20 < 0) || ((int)uVar6 <= iVar20)) break;
    iVar7 = pOVar16[uVar24].m_topei[1];
    if ((iVar7 < 0) ||
       (((((int)uVar6 <= iVar7 || (iVar10 = pOVar16[uVar24].m_topei[2], iVar10 < 0)) ||
         ((int)uVar6 <= iVar10)) ||
        ((iVar11 = pOVar16[uVar24].m_topei[3], iVar11 < 0 || ((int)uVar6 <= iVar11)))))) break;
    this_00 = (pOVar17->m_F).m_a + uVar24;
    tfvi[0] = piVar14[this_00->vi[0]];
    tfvi[1] = piVar14[this_00->vi[1]];
    iVar12 = this_00->vi[2];
    tfvi[2] = piVar14[iVar12];
    iVar13 = this_00->vi[3];
    tfvi[3] = piVar14[iVar13];
    if (((iVar7 != 0 || iVar20 != 0) || iVar10 != 0) || iVar11 != 0) {
      bVar19 = ON_MeshFace::IsValid(this_00,mesh_vertex_count);
      if (!bVar19) break;
      if (iVar12 == iVar13) {
        lVar28 = 3;
        if (iVar10 != iVar11) break;
      }
      else {
        lVar28 = 4;
        if (iVar10 == iVar11) break;
      }
      for (lVar23 = 0; lVar23 != lVar28; lVar23 = lVar23 + 1) {
        pOVar3 = pOVar15 + pOVar16[uVar24].m_topei[lVar23];
        uVar26 = (ulong)(uint)pOVar15[pOVar16[uVar24].m_topei[lVar23]].m_topf_count;
        if (pOVar15[pOVar16[uVar24].m_topei[lVar23]].m_topf_count < 1) {
          uVar26 = 0;
        }
        uVar25 = 0;
        do {
          if (uVar26 == uVar25) goto LAB_00522358;
          puVar1 = (uint *)(pOVar3->m_topfi + uVar25);
          uVar25 = uVar25 + 1;
        } while (uVar24 != *puVar1);
        if (pOVar16[uVar24].m_reve[lVar23] == '\0') {
          if (pOVar3->m_topvi[0] != tfvi[(int)lVar23 - 1U & 3]) goto LAB_00522358;
          iVar20 = pOVar3->m_topvi[1];
        }
        else {
          if (pOVar3->m_topvi[1] != tfvi[(int)lVar23 - 1U & 3]) goto LAB_00522358;
          iVar20 = pOVar3->m_topvi[0];
        }
        if (iVar20 != tfvi[lVar23]) goto LAB_00522358;
      }
    }
  }
LAB_0052235a:
  ON_Workspace::~ON_Workspace(&ws);
  return bVar30;
}

Assistant:

bool ON_MeshTopology::IsValid() const
{
  ON_Workspace ws;
  int topvi, topei, topfi, vi, fi, j, jmax, k, tfvi[4];
  ON_3fPoint p;

  WaitUntilReady(0);

  // simple checks
  if ( 1 != m_b32IsValid )
    return false;
  if ( !m_mesh )
    return false;
  if ( this != &(m_mesh->Topology()) )
    return false;
  const int v_count = m_mesh->VertexCount();
  const int f_count = m_mesh->FaceCount();
  const int topv_count = TopVertexCount();
  const int tope_count = TopEdgeCount();
  const int topf_count = TopFaceCount();
  if ( topv_count > v_count || topv_count < 0 )
    return false;
  if ( topv_count == 0 && v_count > 0 )
    return false;
  if ( topf_count != f_count )
    return false;
  if ( f_count > 0 && tope_count < 3 )
    return false;
  if ( m_topv_map.Count() != v_count )
    return false;

  // check vertex information
  for ( vi = 0; vi < v_count; vi++ ) {
    topvi = m_topv_map[vi];
    if ( topvi < 0 || topvi >= topv_count )
      return false;
  }

  char* vCheck = (char*)ws.GetMemory( v_count*sizeof(*vCheck) );
  memset( vCheck, 0, v_count*sizeof(*vCheck) );
  for ( topvi = 0; topvi < topv_count; topvi++ )
  {
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    if ( topv.m_v_count <= 0 )
      return false;
    if ( !topv.m_vi )
      return false;
    p = TopVertexPoint(topvi);
    for ( j = 0; j < topv.m_v_count; j++ ) {
      vi = topv.m_vi[j];
      if ( vi < 0 )
        return false;
      if ( vi >= v_count )
        return false;
      if ( vCheck[vi] != 0 )
        return false; // mesh.m_V[vi] is referenced multiple times
      if ( compare3fPoint( &p, &m_mesh->m_V[vi] ) )
        return false; // mesh.m_V[vi] not at same location as topv
      if ( m_topv_map[vi] != topvi )
        return false; 
      vCheck[vi] = 1;
    }

    // check that edges in m_topei[] list have topvi has a start/end
    if ( topv.m_tope_count < 0 )
      return false;
    if ( topv.m_tope_count == 0 && topv.m_topei )
      return false; // array should be nullptr
    if ( topv.m_tope_count > 0 && !topv.m_topei )
      return false; // array should not be nullptr
    for ( j = 0; j < topv.m_tope_count; j++ ) {
      topei = topv.m_topei[j];
      if ( topei < 0 )
        return false;
      if ( topei >= tope_count )
        return false;
      const ON_MeshTopologyEdge& tope = m_tope[topei];
      if ( tope.m_topvi[0] != topvi && tope.m_topvi[1] != topvi )
        return false; // edge doesn't reference this top vtx
      for ( k = 0; k < j; k++ ) {
        if ( topv.m_topei[k] == topei )
          return false; // edge listed multiple times
      }
    }
  }

  // make sure every mesh.m_V[] maps to a topological vertex
  for ( vi = 0; vi < v_count; vi++ ) {
    if ( vCheck[vi] != 1 )
      return false; // mesh.m_V[vi] is not referenced
    topvi = m_topv_map[vi];
    if ( topvi < 0 )
      return false;
    if ( topvi >= topv_count )
      return false;
    const ON_MeshTopologyVertex& topv = m_topv[topvi];
    for ( j = 0; j < topv.m_v_count; j++ ) {
      if ( topv.m_vi[j] == vi )
        break;
    }
    if ( j >= topv.m_v_count )
      return false; // bogus m_topv_map[] array
  }

  // check edges
  for ( topei = 0; topei < tope_count; topei++ ) {
    const ON_MeshTopologyEdge& tope = m_tope[topei];
    if ( tope.m_topvi[0] < 0 || tope.m_topvi[0] >= topv_count )
      return false;
    if ( tope.m_topvi[1] < 0 || tope.m_topvi[1] >= topv_count )
      return false;
    if ( tope.m_topvi[0] == tope.m_topvi[1] )
      return false;

    const ON_MeshTopologyVertex& topv0 = m_topv[tope.m_topvi[0]];
    for ( j = 0; j < topv0.m_tope_count; j++ ) {
      if ( topv0.m_topei[j] == topei )
        break;
    }
    if ( j >= topv0.m_tope_count )
      return false; // start vtx not linked to edge

    const ON_MeshTopologyVertex& topv1 = m_topv[tope.m_topvi[1]];
    for ( j = 0; j < topv1.m_tope_count; j++ ) {
      if ( topv1.m_topei[j] == topei )
        break;
    }
    if ( j >= topv1.m_tope_count )
      return false; // end vtx not linked to edge

    if ( tope.m_topf_count < 0 )
      return false;
    if ( tope.m_topf_count == 0 && tope.m_topfi )
      return false; // array should be nullptr
    if ( tope.m_topf_count > 0 && !tope.m_topfi )
      return false; // array should not be nullptr
    for ( j = 0; j < tope.m_topf_count; j++ ) {
      fi = tope.m_topfi[j];
      if ( fi < 0 || fi >= f_count )
        return false;
      const ON_MeshTopologyFace& topf = m_topf[fi];
      for ( k = 0; k < 4; k++ ) {
        if ( topf.m_topei[k] == topei )
          break;
      }
      if ( k >= 4 )
        return false; // edge not in face's list
    }
  }

  // check faces
  for ( fi = 0; fi < f_count; fi++ ) {
    topfi = fi;
    const ON_MeshTopologyFace& topf = m_topf[topfi];
    const ON_MeshFace& f = m_mesh->m_F[fi];
    if ( topf.m_topei[0] < 0 || topf.m_topei[0] >= tope_count )
      return false;
    if ( topf.m_topei[1] < 0 || topf.m_topei[1] >= tope_count )
      return false;
    if ( topf.m_topei[2] < 0 || topf.m_topei[2] >= tope_count )
      return false;
    if ( topf.m_topei[3] < 0 || topf.m_topei[3] >= tope_count )
      return false;
    tfvi[0] = m_topv_map[f.vi[0]];
    tfvi[1] = m_topv_map[f.vi[1]];
    tfvi[2] = m_topv_map[f.vi[2]];
    tfvi[3] = m_topv_map[f.vi[3]];
    if (    topf.m_topei[0] != 0 || topf.m_topei[1] != 0 
         || topf.m_topei[2] != 0 || topf.m_topei[3] != 0 ) {
      if ( !f.IsValid(v_count) )
        return false;
      if ( f.IsTriangle() ) {
        if (topf.m_topei[2] != topf.m_topei[3] )
          return false;
        jmax = 3;
      }
      else {
        if (topf.m_topei[2] == topf.m_topei[3] )
          return false;
        jmax = 4;
      }
      for ( j = 0; j < jmax; j++ ) {
        const ON_MeshTopologyEdge& tope = m_tope[topf.m_topei[j]];
        for ( k = 0; k < tope.m_topf_count; k++ ) {
          if ( tope.m_topfi[k] == topfi )
            break;
        }
        if ( k >= tope.m_topf_count )
          return false;

        // topedge m_tope[topf.m_topei[j]] ENDS at topvtx m_topv[tfvi[j]]
        if ( topf.m_reve[j] ) {
          if ( tope.m_topvi[1] != tfvi[(j+3)%4] )
            return false;
          if ( tope.m_topvi[0] != tfvi[j] )
            return false;
        }
        else {
          if ( tope.m_topvi[0] != tfvi[(j+3)%4] )
            return false;
          if ( tope.m_topvi[1] != tfvi[j] )
            return false;
        }
      }      
    }
    else {
      // all topf.m_topei[] must be zeros
      if (    topf.m_topei[0] != 0 || topf.m_topei[1] != 0 
           || topf.m_topei[2] != 0 || topf.m_topei[3] != 0 )
        return false;
    }
  }
  return true;
}